

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O3

void __thiscall Label::draw(Label *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  Theme *pTVar4;
  int iVar5;
  bool bVar6;
  undefined4 in_XMM1_Da;
  SaveState state;
  undefined4 local_438;
  undefined4 local_428;
  undefined1 local_418 [1024];
  
  pTVar4 = ((this->super_Widget).dialog)->theme;
  al_store_state(local_418,0xffff);
  uVar1 = (pTVar4->fg).r;
  uVar2 = (pTVar4->fg).b;
  iVar5 = (*(this->super_Widget)._vptr_Widget[0x10])(this);
  local_438 = uVar1;
  local_428 = uVar2;
  if ((char)iVar5 != '\0') {
    local_438 = al_map_rgb(0x40,0x40,0x40);
    local_428 = in_XMM1_Da;
  }
  al_set_blender(0,1,3);
  iVar5 = (this->super_Widget).x1;
  bVar6 = this->centred == true;
  if (bVar6) {
    iVar3 = (this->super_Widget).x2;
    iVar5 = ((iVar5 + iVar3) - (iVar5 + iVar3 + 1 >> 0x1f)) + 1 >> 1;
  }
  al_draw_text(local_438,local_428,(float)iVar5,(float)(this->super_Widget).y1,pTVar4->font,bVar6,
               (this->text)._M_dataplus._M_p);
  al_restore_state(local_418);
  return;
}

Assistant:

void Label::draw()
{
   const Theme & theme = this->dialog->get_theme();
   SaveState state;
   ALLEGRO_COLOR fg = theme.fg;

   if (is_disabled()) {
      fg = al_map_rgb(64, 64, 64);
   }

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);
   if (centred) {
      al_draw_text(theme.font, fg, (this->x1 + this->x2 + 1)/2,
         this->y1, ALLEGRO_ALIGN_CENTRE, this->text.c_str());
   }
   else {
      al_draw_text(theme.font, fg, this->x1, this->y1, 0, this->text.c_str());
   }
}